

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O2

bool check_barred(CHAR_DATA *ch,ROOM_INDEX_DATA *to_room)

{
  ushort uVar1;
  CHAR_DATA *ch_00;
  bool bVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  MOB_INDEX_DATA *in_RAX;
  CClass *pCVar7;
  OBJ_DATA *pOVar8;
  BARRED_DATA *pBVar9;
  CHAR_DATA **ppCVar10;
  
  ppCVar10 = &ch->in_room->people;
  uVar5 = 0;
  do {
    bVar3 = (byte)in_RAX;
    ch_00 = *ppCVar10;
    if (ch_00 == (CHAR_DATA *)0x0) {
LAB_002b4212:
      return (bool)(ch_00 != (CHAR_DATA *)0x0 & bVar3);
    }
    bVar2 = is_npc(ch_00);
    in_RAX = (MOB_INDEX_DATA *)(ulong)bVar2;
    if (bVar2) {
      in_RAX = ch_00->pIndexData;
      pBVar9 = in_RAX->barred_entry;
      if ((pBVar9 == (BARRED_DATA *)0x0) ||
         (in_RAX = (MOB_INDEX_DATA *)(ulong)(ushort)pBVar9->vnum, pBVar9->vnum != to_room->vnum))
      goto LAB_002b41fb;
      sVar4 = pBVar9->type;
      if (sVar4 == 0) {
        pCVar7 = char_data::Class(ch);
        uVar5 = CClass::GetIndex(pCVar7);
        pBVar9 = ch_00->pIndexData->barred_entry;
        sVar4 = pBVar9->type;
      }
      switch(sVar4) {
      case 1:
        uVar5 = (uint)ch->cabal;
        break;
      case 2:
        uVar5 = (uint)ch->size;
        break;
      case 3:
        pOVar8 = get_eq_char(ch,0x13);
        pBVar9 = ch_00->pIndexData->barred_entry;
        if ((pOVar8 != (OBJ_DATA *)0x0) || (pBVar9->value == 0)) {
          uVar5 = (uint)pOVar8->pIndexData->vnum;
          sVar4 = pBVar9->type;
          goto switchD_002b4121_default;
        }
        goto LAB_002b4204;
      case 4:
        uVar5 = (uint)ch->level;
        break;
      default:
switchD_002b4121_default:
        if (sVar4 == 0) {
          pCVar7 = char_data::Class(ch);
          iVar6 = CClass::GetIndex(pCVar7);
          pBVar9 = ch_00->pIndexData->barred_entry;
          if ((((iVar6 == pBVar9->value) && ((ch_00->act[0] & 0x2000000) != 0)) && (0 < ch->pause))
             && (ch->ghost < 1)) {
            bVar2 = is_immortal(ch);
            if (!bVar2) {
              send_to_char("Your guild will not offer you sanctuary yet.\n\r",ch);
              bVar3 = 1;
              goto LAB_002b4212;
            }
            pBVar9 = ch_00->pIndexData->barred_entry;
          }
        }
      }
      uVar1 = pBVar9->comparison;
      in_RAX = (MOB_INDEX_DATA *)(ulong)uVar1;
      if (uVar1 == 2) {
        in_RAX = (MOB_INDEX_DATA *)(ulong)(uint)(int)pBVar9->value;
        if ((int)uVar5 <= (int)pBVar9->value) goto LAB_002b4204;
      }
      else if (uVar1 == 1) {
        in_RAX = (MOB_INDEX_DATA *)(ulong)(uint)(int)pBVar9->value;
        if ((int)pBVar9->value <= (int)uVar5) goto LAB_002b4204;
      }
      else if ((uVar1 == 0) &&
              (in_RAX = (MOB_INDEX_DATA *)(ulong)(uint)(int)pBVar9->value,
              uVar5 != (int)pBVar9->value)) {
LAB_002b4204:
        bVar3 = bar_entry(ch,ch_00,to_room);
        goto LAB_002b4212;
      }
    }
LAB_002b41fb:
    ppCVar10 = &ch_00->next_in_room;
  } while( true );
}

Assistant:

bool check_barred(CHAR_DATA *ch, ROOM_INDEX_DATA *to_room)
{
	int field = 0;

	for (auto blocker = ch->in_room->people; blocker != nullptr; blocker = blocker->next_in_room)
	{
		if (is_npc(blocker)
			&& blocker->pIndexData->barred_entry
			&& blocker->pIndexData->barred_entry->vnum == to_room->vnum)
		{

			if (blocker->pIndexData->barred_entry->type == BAR_CLASS)
				field = ch->Class()->GetIndex();

			if (blocker->pIndexData->barred_entry->type == BAR_CABAL)
				field = ch->cabal;

			if (blocker->pIndexData->barred_entry->type == BAR_SIZE)
				field = ch->size;

			if (blocker->pIndexData->barred_entry->type == BAR_LEVEL)
				field = ch->level;

			if (blocker->pIndexData->barred_entry->type == BAR_TATTOO)
			{
				auto tattoo = get_eq_char(ch, WEAR_BRAND);

				if (!tattoo && blocker->pIndexData->barred_entry->value)
					return bar_entry(ch, blocker, to_room);

				field = tattoo->pIndexData->vnum;
			}

			if (blocker->pIndexData->barred_entry->type == BAR_CLASS
				&& ch->Class()->GetIndex() == blocker->pIndexData->barred_entry->value
				&& IS_SET(blocker->act, ACT_GUILDGUARD)
				&& ch->pause > 0
				&& ch->ghost <= 0
				&& !is_immortal(ch))
			{
				send_to_char("Your guild will not offer you sanctuary yet.\n\r", ch);
				return true;
			}

			if ((blocker->pIndexData->barred_entry->comparison == BAR_EQUAL_TO && field != blocker->pIndexData->barred_entry->value)
				|| (blocker->pIndexData->barred_entry->comparison == BAR_LESS_THAN && field >= blocker->pIndexData->barred_entry->value)
				|| (blocker->pIndexData->barred_entry->comparison == BAR_GREATER_THAN && field <= blocker->pIndexData->barred_entry->value))
			{
				return bar_entry(ch, blocker, to_room);
			}
		}
	}

	return false;
}